

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::logParams
          (TextureBorderClampTest *this,IterationConfig *config,ReferenceParams *samplerParams)

{
  deUint32 dVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  Vector<float,_4> *value;
  Vector<int,_4> VVar4;
  Vector<unsigned_int,_4> VVar5;
  Enum<int,_2UL> EVar6;
  Enum<int,_2UL> local_6e0;
  MessageBuilder local_6d0;
  MessageBuilder local_550;
  MessageBuilder local_3d0;
  GetNameFunc local_250;
  int local_248;
  Enum<int,_2UL> local_240;
  GetNameFunc local_230;
  int local_228;
  Enum<int,_2UL> local_220;
  char *local_210;
  char *local_208 [3];
  MessageBuilder local_1f0;
  GenericVec4 local_70;
  GenericVec4 local_60;
  GenericVec4 local_50;
  undefined1 local_40 [8];
  string borderColorString;
  ReferenceParams *samplerParams_local;
  IterationConfig *config_local;
  TextureBorderClampTest *this_local;
  
  borderColorString.field_2._8_8_ = samplerParams;
  if (this->m_channelClass == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    VVar4 = rr::GenericVec4::get<int>(&local_50);
    de::toString<tcu::Vector<int,4>>((string *)local_40,(de *)&local_50,VVar4.m_data._8_8_);
  }
  else if (this->m_channelClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    VVar5 = rr::GenericVec4::get<unsigned_int>(&local_60);
    de::toString<tcu::Vector<unsigned_int,4>>((string *)local_40,(de *)&local_60,VVar5.m_data._8_8_)
    ;
  }
  else {
    rr::GenericVec4::get<float>(&local_70);
    de::toString<tcu::Vector<float,4>>((string *)local_40,(de *)&local_70,value);
  }
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1f0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_1f0,
                      (char (*) [53])"Rendering full screen quad, tex coords bottom-left: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&config->p0);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])", top-right ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&config->p1);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])"Border color is ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_40);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [22])"Texture lookup bias: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(Vector<float,_4> *)(borderColorString.field_2._8_8_ + 0x34));
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [23])"Texture lookup scale: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(Vector<float,_4> *)(borderColorString.field_2._8_8_ + 0x24));
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"Filters: min = ");
  dVar1 = glu::getGLFilterMode(*(FilterMode *)(borderColorString.field_2._8_8_ + 0x50));
  local_208[0] = glu::getTextureFilterName(dVar1);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_208);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])", mag = ");
  dVar1 = glu::getGLFilterMode(*(FilterMode *)(borderColorString.field_2._8_8_ + 0x54));
  local_210 = glu::getTextureFilterName(dVar1);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_210);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"Wrap mode: s = ");
  EVar6 = glu::getRepeatModeStr(config->sWrapMode);
  local_230 = EVar6.m_getName;
  local_228 = EVar6.m_value;
  local_220.m_getName = local_230;
  local_220.m_value = local_228;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_220);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])", t = ");
  EVar6 = glu::getRepeatModeStr(config->tWrapMode);
  local_250 = EVar6.m_getName;
  local_248 = EVar6.m_value;
  local_240.m_getName = local_250;
  local_240.m_value = local_248;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_240);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1f0);
  if (this->m_sampleMode == MODE_DEPTH) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_3d0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_3d0,(char (*) [46])"Depth stencil texture mode is DEPTH_COMPONENT");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3d0);
  }
  else if (this->m_sampleMode == MODE_STENCIL) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_550,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_550,(char (*) [44])"Depth stencil texture mode is STENCIL_INDEX");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_550);
  }
  if (config->compareMode != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_6d0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_6d0,(char (*) [48])"Texture mode is COMPARE_REF_TO_TEXTURE, mode = ")
    ;
    EVar6 = glu::getCompareFuncStr(config->compareMode);
    local_6e0.m_getName = EVar6.m_getName;
    local_6e0.m_value = EVar6.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_6e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [27])"Compare reference value = ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&config->compareRef);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6d0);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void TextureBorderClampTest::logParams (const IterationConfig& config, const glu::TextureTestUtil::ReferenceParams& samplerParams)
{
	const std::string				borderColorString	= (m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)   ? (de::toString(config.borderColor.get<deInt32>()))
														: (m_channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) ? (de::toString(config.borderColor.get<deUint32>()))
														:																  (de::toString(config.borderColor.get<float>()));

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Rendering full screen quad, tex coords bottom-left: " << config.p0 << ", top-right " << config.p1 << "\n"
						<< "Border color is " << borderColorString << "\n"
						<< "Texture lookup bias: " << samplerParams.colorBias << "\n"
						<< "Texture lookup scale: " << samplerParams.colorScale << "\n"
						<< "Filters: min = " << glu::getTextureFilterName(glu::getGLFilterMode(samplerParams.sampler.minFilter))
							<< ", mag = " << glu::getTextureFilterName(glu::getGLFilterMode(samplerParams.sampler.magFilter)) << "\n"
						<< "Wrap mode: s = " << glu::getRepeatModeStr(config.sWrapMode)
							<< ", t = " << glu::getRepeatModeStr(config.tWrapMode) << "\n"
						<< tcu::TestLog::EndMessage;

	if (m_sampleMode == tcu::Sampler::MODE_DEPTH)
		m_testCtx.getLog() << tcu::TestLog::Message << "Depth stencil texture mode is DEPTH_COMPONENT" << tcu::TestLog::EndMessage;
	else if (m_sampleMode == tcu::Sampler::MODE_STENCIL)
		m_testCtx.getLog() << tcu::TestLog::Message << "Depth stencil texture mode is STENCIL_INDEX" << tcu::TestLog::EndMessage;

	if (config.compareMode != GL_NONE)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Texture mode is COMPARE_REF_TO_TEXTURE, mode = " << glu::getCompareFuncStr(config.compareMode) << "\n"
							<< "Compare reference value = " << config.compareRef << "\n"
							<< tcu::TestLog::EndMessage;
	}
}